

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O0

Maybe<kj::StringPtr> * __thiscall
kj::HttpHeaders::get(Maybe<kj::StringPtr> *__return_storage_ptr__,HttpHeaders *this,HttpHeaderId id)

{
  bool bVar1;
  StringPtr *pSVar2;
  undefined1 local_38 [8];
  StringPtr result;
  HttpHeaders *this_local;
  HttpHeaderId id_local;
  
  this_local = (HttpHeaders *)id.table;
  id_local.table._0_4_ = id.id;
  result.content.size_ = (size_t)this;
  id_local._8_8_ = __return_storage_ptr__;
  HttpHeaderId::requireFrom((HttpHeaderId *)&this_local,this->table);
  pSVar2 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,(ulong)(uint)id_local.table);
  local_38 = (undefined1  [8])(pSVar2->content).ptr;
  result.content.ptr = (char *)(pSVar2->content).size_;
  bVar1 = StringPtr::operator==((StringPtr *)local_38,(void *)0x0);
  if (bVar1) {
    Maybe<kj::StringPtr>::Maybe(__return_storage_ptr__);
  }
  else {
    Maybe<kj::StringPtr>::Maybe(__return_storage_ptr__,(StringPtr *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline kj::Maybe<kj::StringPtr> HttpHeaders::get(HttpHeaderId id) const {
  id.requireFrom(*table);
  auto result = indexedHeaders[id.id];
  return result == nullptr ? kj::Maybe<kj::StringPtr>(kj::none) : result;
}